

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O2

MXFWriter * __thiscall AS_02::IAB::MXFWriter::Finalize(MXFWriter *this)

{
  WriterState_t WVar1;
  char cVar2;
  int64_t iVar3;
  ILogSink *this_00;
  RuntimeError *this_01;
  MXFWriter *in_RSI;
  undefined1 *puVar4;
  RuntimeError e;
  byte_t clip_buffer [8];
  
  WVar1 = ((in_RSI->m_Writer).m_p)->m_State;
  if (WVar1 == ST_BEGIN) {
    puVar4 = Kumu::RESULT_INIT;
  }
  else {
    if (WVar1 == ST_RUNNING) {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&Kumu::RESULT_OK);
      iVar3 = Kumu::IFileReader::TellPosition
                        ((IFileReader *)
                         &(((in_RSI->m_Writer).m_p)->
                          super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                          super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File);
      Kumu::FileReader::Seek
                (&e,&(((in_RSI->m_Writer).m_p)->super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>)
                     .super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File,
                 in_RSI->m_ClipStart + 0x10,0);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&e);
      Kumu::Result_t::~Result_t((Result_t *)&e);
      clip_buffer[0] = '\0';
      clip_buffer[1] = '\0';
      clip_buffer[2] = '\0';
      clip_buffer[3] = '\0';
      clip_buffer[4] = '\0';
      clip_buffer[5] = '\0';
      clip_buffer[6] = '\0';
      clip_buffer[7] = '\0';
      cVar2 = Kumu::write_BER(clip_buffer,
                              (((in_RSI->m_Writer).m_p)->
                              super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                              super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_StreamOffset - 0x18,8)
      ;
      if (cVar2 == '\0') {
        this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
        Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)Kumu::RESULT_FAIL);
      }
      else {
        Kumu::FileWriter::Write((uchar *)&e,(int)(in_RSI->m_Writer).m_p + 0x10,(uint *)clip_buffer);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&e);
        Kumu::Result_t::~Result_t((Result_t *)&e);
        if (*(int *)&this->_vptr_MXFWriter < 0) {
          this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
          Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
        }
        else {
          Kumu::FileReader::Seek
                    (&e,&(((in_RSI->m_Writer).m_p)->
                         super_h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>).
                         super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_File,iVar3,0);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&e);
          Kumu::Result_t::~Result_t((Result_t *)&e);
          if (*(int *)&this->_vptr_MXFWriter < 0) {
            this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
            Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
          }
          else {
            h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR>::WriteAS02Footer
                      ((h__AS02Writer<AS_02::MXF::AS02IndexWriterVBR> *)&e);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&e);
            Kumu::Result_t::~Result_t((Result_t *)&e);
            if (-1 < *(int *)&this->_vptr_MXFWriter) {
              Reset(in_RSI);
              return this;
            }
            this_01 = (RuntimeError *)__cxa_allocate_exception(0x78);
            Kumu::RuntimeError::RuntimeError(this_01,(Result_t *)this);
          }
        }
      }
      __cxa_throw(this_01,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
    }
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_IAB.cpp"
               ,0x137);
    puVar4 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar4);
  return this;
}

Assistant:

Result_t
AS_02::IAB::MXFWriter::Finalize() {

  /* are we running */

  if (this->m_Writer->m_State == ST_BEGIN) {
    return Kumu::RESULT_INIT;
  }
  if (this->m_Writer->m_State != ST_RUNNING) {
    KM_RESULT_STATE_HERE();
    return RESULT_STATE;
  }


  Result_t result = RESULT_OK;

  try {

    /* write clip length */

    ui64_t current_position = this->m_Writer->m_File.TellPosition();

    result = this->m_Writer->m_File.Seek(m_ClipStart + ASDCP::SMPTE_UL_LENGTH);

    byte_t clip_buffer[CLIP_BER_LENGTH_SIZE] = { 0 };

    ui64_t size = static_cast<ui64_t>(this->m_Writer->m_StreamOffset) /* total size of the KLV */ - RESERVED_KL_SIZE;

    bool check = Kumu::write_BER(clip_buffer, size, CLIP_BER_LENGTH_SIZE);

    if (!check) {
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    result = this->m_Writer->m_File.Write(clip_buffer, CLIP_BER_LENGTH_SIZE);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    result = this->m_Writer->m_File.Seek(current_position);

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

    /* write footer */

    result = this->m_Writer->WriteAS02Footer();

    if (result.Failure()) {
      throw Kumu::RuntimeError(result);
    }

  } catch (Kumu::RuntimeError e) {

    /* nothing to do since we are about to reset */

    result = e.GetResult();

  }

  /* we are ready to start again */

  this->Reset();

  return result;
}